

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::LossLayer::SerializeWithCachedSizes
          (LossLayer *this,CodedOutputStream *output)

{
  string *psVar1;
  size_type sVar2;
  uint32 uVar3;
  
  psVar1 = (this->name_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,"CoreML.Specification.LossLayer.name"
              );
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,(this->name_).ptr_,output)
    ;
  }
  uVar3 = this->_oneof_case_[0];
  if (uVar3 == 10) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&((this->LossLayerType_).categoricalcrossentropylosslayer_)->super_MessageLite,
               output);
    uVar3 = this->_oneof_case_[0];
  }
  if (uVar3 == 0xb) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xb,&((this->LossLayerType_).categoricalcrossentropylosslayer_)->super_MessageLite,
               output);
    return;
  }
  return;
}

Assistant:

void LossLayer::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.LossLayer)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string name = 1;
  if (this->name().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.LossLayer.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // .CoreML.Specification.CategoricalCrossEntropyLossLayer categoricalCrossEntropyLossLayer = 10;
  if (has_categoricalcrossentropylosslayer()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *LossLayerType_.categoricalcrossentropylosslayer_, output);
  }

  // .CoreML.Specification.MeanSquaredErrorLossLayer meanSquaredErrorLossLayer = 11;
  if (has_meansquarederrorlosslayer()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      11, *LossLayerType_.meansquarederrorlosslayer_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.LossLayer)
}